

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O2

int __thiscall Jupiter::Timer::think(Timer *this)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  
  lVar1 = std::chrono::_V2::steady_clock::now();
  uVar2 = 0;
  if ((this->m_next_call).__d.__r <= lVar1) {
    if (this->m_iterations == 0) {
      uVar3 = 0;
      uVar2 = 0;
    }
    else {
      uVar3 = this->m_iterations - 1;
      this->m_iterations = uVar3;
      uVar2 = (uint)(uVar3 == 0);
    }
    (*this->m_function)(uVar3,this->m_parameters);
    lVar1 = std::chrono::_V2::steady_clock::now();
    (this->m_next_call).__d.__r = (this->m_delay).__r * 1000000 + lVar1;
  }
  return uVar2;
}

Assistant:

int Jupiter::Timer::think()
{
	if (m_next_call <= std::chrono::steady_clock::now())
	{
		int killMe = 0;

		if (m_iterations != 0 && --m_iterations == 0)
			killMe = 1;

		m_function(m_iterations, m_parameters);
		m_next_call = m_delay + std::chrono::steady_clock::now();

		return killMe;
	}

	return 0;
}